

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_xonly_pubkey_from_pubkey
              (secp256k1_context *ctx,secp256k1_xonly_pubkey *xonly_pubkey,int *pk_parity,
              secp256k1_pubkey *pubkey)

{
  int iVar1;
  long in_RCX;
  int *in_RDX;
  long in_RSI;
  int tmp;
  secp256k1_ge pk;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  secp256k1_ge *in_stack_ffffffffffffff80;
  secp256k1_context *in_stack_ffffffffffffff88;
  undefined4 local_4;
  
  if (in_RSI == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)in_stack_ffffffffffffff80,
               (char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    local_4 = 0;
  }
  else if (in_RCX == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)in_stack_ffffffffffffff80,
               (char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    local_4 = 0;
  }
  else {
    iVar1 = secp256k1_pubkey_load
                      (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                       (secp256k1_pubkey *)
                       CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    if (iVar1 == 0) {
      local_4 = 0;
    }
    else {
      iVar1 = secp256k1_extrakeys_ge_even_y(in_stack_ffffffffffffff80);
      if (in_RDX != (int *)0x0) {
        *in_RDX = iVar1;
      }
      secp256k1_xonly_pubkey_save
                ((secp256k1_xonly_pubkey *)in_stack_ffffffffffffff80,
                 (secp256k1_ge *)CONCAT44(iVar1,in_stack_ffffffffffffff78));
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

int secp256k1_xonly_pubkey_from_pubkey(const secp256k1_context* ctx, secp256k1_xonly_pubkey *xonly_pubkey, int *pk_parity, const secp256k1_pubkey *pubkey) {
    secp256k1_ge pk;
    int tmp;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(xonly_pubkey != NULL);
    ARG_CHECK(pubkey != NULL);

    if (!secp256k1_pubkey_load(ctx, &pk, pubkey)) {
        return 0;
    }
    tmp = secp256k1_extrakeys_ge_even_y(&pk);
    if (pk_parity != NULL) {
        *pk_parity = tmp;
    }
    secp256k1_xonly_pubkey_save(xonly_pubkey, &pk);
    return 1;
}